

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O1

Rtm_Man_t * Rtm_ManAlloc(Aig_Man_t *p)

{
  Rtm_Man_t *pRVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  Aig_MmFlex_t *pAVar4;
  int iVar5;
  int iVar6;
  
  pRVar1 = (Rtm_Man_t *)malloc(0x30);
  pRVar1->vObjs = (Vec_Ptr_t *)0x0;
  pRVar1->vPis = (Vec_Ptr_t *)0x0;
  pRVar1->vPos = (Vec_Ptr_t *)0x0;
  pRVar1->pMem = (Aig_MmFlex_t *)0x0;
  pRVar1->pExtra = (uint *)0x0;
  pRVar1->nExtraCur = 0;
  pRVar1->nExtraAlloc = 0;
  iVar6 = p->vObjs->nSize - p->nDeleted;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  if (iVar6 - 1U < 7) {
    iVar6 = 8;
  }
  pVVar2->nSize = 0;
  pVVar2->nCap = iVar6;
  if (iVar6 == 0) {
    ppvVar3 = (void **)0x0;
  }
  else {
    ppvVar3 = (void **)malloc((long)iVar6 << 3);
  }
  pVVar2->pArray = ppvVar3;
  pRVar1->vObjs = pVVar2;
  iVar6 = p->nObjs[2];
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  iVar5 = 8;
  if (6 < iVar6 - 1U) {
    iVar5 = iVar6;
  }
  pVVar2->nSize = 0;
  pVVar2->nCap = iVar5;
  if (iVar5 == 0) {
    ppvVar3 = (void **)0x0;
  }
  else {
    ppvVar3 = (void **)malloc((long)iVar5 << 3);
  }
  pVVar2->pArray = ppvVar3;
  pRVar1->vPis = pVVar2;
  iVar6 = p->nObjs[3];
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  iVar5 = 8;
  if (6 < iVar6 - 1U) {
    iVar5 = iVar6;
  }
  pVVar2->nSize = 0;
  pVVar2->nCap = iVar5;
  if (iVar5 == 0) {
    ppvVar3 = (void **)0x0;
  }
  else {
    ppvVar3 = (void **)malloc((long)iVar5 << 3);
  }
  pVVar2->pArray = ppvVar3;
  pRVar1->vPos = pVVar2;
  pAVar4 = Aig_MmFlexStart();
  pRVar1->pMem = pAVar4;
  return pRVar1;
}

Assistant:

Rtm_Man_t * Rtm_ManAlloc( Aig_Man_t * p )
{
    Rtm_Man_t * pRtm;
    // start the manager
    pRtm = ABC_ALLOC( Rtm_Man_t, 1 );
    memset( pRtm, 0, sizeof(Rtm_Man_t) );
    // perform initializations
    pRtm->vObjs = Vec_PtrAlloc( Aig_ManObjNum(p) );
    pRtm->vPis  = Vec_PtrAlloc( Aig_ManCiNum(p) );
    pRtm->vPos  = Vec_PtrAlloc( Aig_ManCoNum(p) );
    pRtm->pMem  = Aig_MmFlexStart();
    return pRtm;
}